

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Prefix(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  size_type sVar4;
  eval_error *this_00;
  element_type *t_fname;
  char *__s;
  allocator<char> local_151;
  string local_150;
  undefined1 local_12d;
  File_Position local_12c;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  byte local_a9;
  Static_String *pSStack_a8;
  bool is_char;
  value_type *oper;
  const_iterator __end3;
  const_iterator __begin3;
  array<chaiscript::utility::Static_String,_6UL> *__range3;
  array<chaiscript::utility::Static_String,_6UL> prefix_opers;
  size_type prev_stack_top;
  Depth_Counter dc;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = this;
  Depth_Counter::Depth_Counter((Depth_Counter *)&prev_stack_top,this);
  prefix_opers._M_elems[5].data =
       (char *)std::
               vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
               ::size(&this->m_match_stack);
  memcpy(&__range3,&DAT_0086be88,0x60);
  __begin3 = (const_iterator)&__range3;
  __end3 = std::array<chaiscript::utility::Static_String,_6UL>::begin
                     ((array<chaiscript::utility::Static_String,_6UL> *)__begin3);
  oper = std::array<chaiscript::utility::Static_String,_6UL>::end
                   ((array<chaiscript::utility::Static_String,_6UL> *)__begin3);
  do {
    if (__end3 == oper) {
      this_local._7_1_ = false;
LAB_0071d0cf:
      Depth_Counter::~Depth_Counter((Depth_Counter *)&prev_stack_top);
      return this_local._7_1_;
    }
    pSStack_a8 = __end3;
    sVar2 = utility::Static_String::size(__end3);
    local_a9 = sVar2 == 1;
    if ((bool)local_a9) {
      pcVar3 = utility::Static_String::c_str(pSStack_a8);
      bVar1 = Char(this,*pcVar3);
      if (!bVar1) goto LAB_0071cdb2;
LAB_0071cdeb:
      sVar4 = std::array<chaiscript::Operator_Precedence,_12UL>::size(&m_operators);
      bVar1 = Operator(this,sVar4 - 1);
      pcVar3 = prefix_opers._M_elems[5].data;
      if (!bVar1) {
        local_12d = 1;
        this_00 = (eval_error *)__cxa_allocate_exception(0x90);
        pcVar3 = utility::Static_String::c_str(pSStack_a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar3,&local_121);
        std::operator+(&local_100,"Incomplete prefix \'",&local_120);
        std::operator+(&local_e0,&local_100,"\' expression");
        File_Position::File_Position(&local_12c,(this->m_position).line,(this->m_position).col);
        t_fname = std::
                  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_filename);
        exception::eval_error::eval_error(this_00,&local_e0,&local_12c,t_fname);
        local_12d = 0;
        __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      __s = utility::Static_String::c_str(pSStack_a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,__s,&local_151);
      ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
      ::
      build_match<chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                  *)this,(size_t)pcVar3,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      this_local._7_1_ = true;
      goto LAB_0071d0cf;
    }
LAB_0071cdb2:
    if (((local_a9 & 1) == 0) && (bVar1 = Symbol(this,pSStack_a8,false), bVar1)) goto LAB_0071cdeb;
    __end3 = __end3 + 1;
  } while( true );
}

Assistant:

bool Prefix() {
        Depth_Counter dc{this};
        const auto prev_stack_top = m_match_stack.size();
        using SS = utility::Static_String;
        const std::array<utility::Static_String, 6> prefix_opers{{SS{"++"}, SS{"--"}, SS{"-"}, SS{"+"}, SS{"!"}, SS{"~"}}};

        for (const auto &oper : prefix_opers) {
          const bool is_char = oper.size() == 1;
          if ((is_char && Char(oper.c_str()[0])) || (!is_char && Symbol(oper))) {
            if (!Operator(m_operators.size() - 1)) {
              throw exception::eval_error("Incomplete prefix '" + std::string(oper.c_str()) + "' expression",
                                          File_Position(m_position.line, m_position.col),
                                          *m_filename);
            }

            build_match<eval::Prefix_AST_Node<Tracer>>(prev_stack_top, oper.c_str());
            return true;
          }
        }

        return false;
      }